

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_property(nk_context *ctx,char *name,nk_property_variant *variant,float inc_per_pixel,
                nk_property_filter filter)

{
  nk_command_buffer *b;
  nk_style_item_data *img;
  nk_vec2 nVar1;
  nk_property nVar2;
  byte bVar3;
  uchar uVar4;
  nk_hash seed;
  nk_property_kind nVar5;
  nk_window *pnVar6;
  nk_panel *pnVar7;
  nk_handle *f;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var8;
  nk_plugin_filter filter_00;
  double dVar9;
  double dVar10;
  nk_plugin_paste p_Var11;
  bool bVar12;
  undefined8 uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  int *piVar16;
  int *piVar17;
  int *piVar18;
  nk_button_behavior behavior;
  nk_widget_layout_states nVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  nk_style_property *pnVar23;
  nk_context *in;
  char *pcVar24;
  long lVar25;
  nk_context *i;
  ulong uVar26;
  nk_flags *pnVar27;
  int *piVar28;
  nk_color c;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  float fVar35;
  float fVar36;
  nk_rect r;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect b_00;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect bounds_02;
  int num_len;
  int dummy_select_end;
  int dummy_select_begin;
  int dummy_cursor;
  int dummy_length;
  int dummy_state;
  nk_rect bounds;
  char dummy_buffer [64];
  char *local_278;
  int *local_270;
  int local_258;
  int local_254;
  int *local_250;
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 local_228;
  float fStack_220;
  float fStack_21c;
  nk_window *local_210;
  nk_rect local_208;
  undefined1 local_1f8 [16];
  int *local_1e0;
  int *local_1d8;
  int *local_1d0;
  nk_hash local_1c4;
  float local_1c0;
  int local_1bc;
  int local_1b8;
  nk_button_behavior local_1b4;
  nk_property_filter local_1b0;
  int local_1ac [5];
  char *local_198;
  int *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  nk_text local_128;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  undefined4 uStack_fc;
  float local_f8;
  float fStack_f4;
  undefined4 uStack_f0;
  float fStack_ec;
  nk_rect local_e8;
  char local_d8 [64];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  char local_78 [72];
  
  local_1ac[4] = 0;
  local_1ac[3] = 0;
  local_1ac[2] = 0;
  local_1ac[1] = 0;
  local_1ac[0] = 0;
  pnVar6 = ctx->current;
  if (pnVar6 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x53de,
                  "void nk_property(struct nk_context *, const char *, struct nk_property_variant *, float, const enum nk_property_filter)"
                 );
  }
  pnVar7 = pnVar6->layout;
  local_1c0 = inc_per_pixel;
  local_1b0 = filter;
  if (pnVar7 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x53df,
                  "void nk_property(struct nk_context *, const char *, struct nk_property_variant *, float, const enum nk_property_filter)"
                 );
  }
  nVar19 = nk_widget(&local_e8,ctx);
  if (nVar19 == NK_WIDGET_INVALID) {
    return;
  }
  bVar3 = *name;
  uVar26 = (ulong)bVar3;
  if (bVar3 == 0) {
LAB_00137580:
    local_1c4 = nk_murmur_hash(name,(int)uVar26,0x2a);
  }
  else {
    if (bVar3 != 0x23) {
      uVar26 = 0;
      do {
        lVar25 = uVar26 + 1;
        uVar26 = uVar26 + 1;
      } while (name[lVar25] != '\0');
      goto LAB_00137580;
    }
    lVar25 = 0;
    do {
      lVar14 = lVar25 + 1;
      lVar25 = lVar25 + 1;
    } while (name[lVar14] != '\0');
    seed = (pnVar6->property).seq;
    (pnVar6->property).seq = seed + 1;
    local_1c4 = nk_murmur_hash(name,(int)lVar25,seed);
    name = name + 1;
  }
  local_1d0 = local_1ac;
  local_1d8 = local_1ac + 1;
  local_1e0 = local_1ac + 2;
  local_250 = local_1ac + 3;
  local_278 = local_78;
  local_270 = local_1ac + 4;
  local_258 = 0;
  if (((pnVar6->property).active != 0) && (local_1c4 == (pnVar6->property).name)) {
    local_278 = (pnVar6->property).buffer;
    local_250 = &(pnVar6->property).length;
    local_1e0 = &(pnVar6->property).cursor;
    local_270 = &(pnVar6->property).state;
    local_1d8 = &(pnVar6->property).select_start;
    local_1d0 = &(pnVar6->property).select_end;
    local_258 = (pnVar6->property).state;
  }
  (ctx->text_edit).clip.copy = (ctx->clip).copy;
  p_Var11 = (ctx->clip).paste;
  (ctx->text_edit).clip.userdata = (ctx->clip).userdata;
  (ctx->text_edit).clip.paste = p_Var11;
  if ((nVar19 == NK_WIDGET_ROM) && ((pnVar6->property).active == 0)) {
    i = (nk_context *)0x0;
  }
  else {
    i = (nk_context *)0x0;
    if ((pnVar7->flags & 0x1000) == 0) {
      i = ctx;
    }
  }
  f = &((ctx->style).font)->userdata;
  local_1b4 = ctx->button_behavior;
  fStack_220 = local_e8.y;
  local_238 = local_e8.h;
  local_178 = local_e8.w;
  fStack_174 = local_e8.h;
  uStack_170 = 0;
  local_208.x = local_e8.x;
  local_208.y = local_e8.y;
  local_208.w = 0.0;
  local_208.h = 0.0;
  local_228 = (nk_command_buffer *)CONCAT44(fStack_220,fStack_220);
  local_1f8 = ZEXT416((uint)(*(float *)(f + 1) * 0.5));
  fVar32 = (ctx->style).property.border;
  local_210 = (nk_window *)CONCAT44(local_210._4_4_,fVar32);
  local_158._0_4_ = local_e8.x + fVar32 + (ctx->style).property.padding.x;
  uStack_150 = 0;
  fStack_234 = local_238;
  fStack_230 = local_238;
  fStack_22c = local_238;
  fStack_21c = fStack_220;
  local_158._4_4_ = fStack_220;
  local_1b8 = nk_strlen(name);
  fVar29 = (*(code *)f[2])(*f,(float)f[1].id,name,local_1b8);
  piVar28 = local_250;
  fVar32 = (ctx->style).property.border;
  nVar1 = (ctx->style).property.padding;
  fVar36 = nVar1.x;
  fVar30 = nVar1.y;
  local_188 = (float)local_158 + (float)local_1f8._0_4_ + fVar36;
  fStack_184 = fVar32 + local_208.y + fVar30;
  fStack_180 = local_158._4_4_ + local_208.w + 0.0;
  fStack_17c = local_208.h + 0.0 + 0.0;
  local_168 = CONCAT44(fVar30,fVar36 + fVar36 + fVar29);
  uStack_160 = 0;
  local_248 = ZEXT416((uint)(fVar32 + fVar32 + fVar30 + fVar30));
  local_118 = local_208.x + local_178;
  local_148 = local_118 - ((float)local_1f8._0_4_ + fVar36);
  fStack_144 = local_208.y;
  fStack_140 = local_208.w;
  fStack_13c = local_208.h;
  fStack_114 = local_208.y;
  fStack_110 = local_208.w;
  fStack_10c = local_208.h;
  if (*local_270 != 1) {
    if (variant->kind == NK_PROPERTY_DOUBLE) {
      nk_dtoa(local_d8,(variant->value).d);
      lVar25 = 0;
      iVar21 = 0;
      do {
        iVar22 = 1;
        if (local_d8[lVar25] != '.') {
          if (local_d8[lVar25] == '\0') goto LAB_00137921;
          if (iVar21 == 3) goto LAB_00137910;
          iVar22 = (uint)(0 < iVar21) + iVar21;
        }
        iVar21 = iVar22;
        lVar25 = lVar25 + 1;
      } while( true );
    }
    if (variant->kind == NK_PROPERTY_FLOAT) {
      nk_dtoa(local_d8,(double)(variant->value).f);
      lVar25 = 0;
      iVar21 = 0;
      do {
        iVar22 = 1;
        if (local_d8[lVar25] != '.') {
          if (local_d8[lVar25] == '\0') goto LAB_00137921;
          if (iVar21 == 3) goto LAB_00137910;
          iVar22 = (uint)(0 < iVar21) + iVar21;
        }
        iVar21 = iVar22;
        lVar25 = lVar25 + 1;
      } while( true );
    }
    nk_itoa(local_d8,(long)(variant->value).i);
    if (local_d8[0] == '\0') {
      lVar25 = 0;
    }
    else {
      lVar25 = 0;
      do {
        lVar14 = lVar25 + 1;
        lVar25 = lVar25 + 1;
      } while (local_d8[lVar14] != '\0');
    }
    goto LAB_00137921;
  }
  local_f8 = (*(code *)f[2])(*f,(float)f[1].id,local_278,*local_250);
  local_f8 = local_f8 + (ctx->style).property.edit.cursor_size;
  local_198 = local_278;
  local_190 = piVar28;
LAB_0013794f:
  fVar36 = local_238 - (float)local_248._0_4_;
  pnVar27 = &ctx->last_widget_state;
  fVar32 = (ctx->style).property.border;
  fVar29 = (ctx->style).property.padding.x;
  local_f8 = fVar29 + fVar29 + local_f8;
  fVar30 = local_148 - (local_188 + (float)local_168);
  if (fVar30 <= local_f8) {
    local_f8 = fVar30;
  }
  local_108 = local_148 - (fVar29 + local_f8);
  fStack_104 = (float)local_228 + fVar32;
  fStack_100 = fStack_144;
  uStack_fc = local_228._4_4_;
  fStack_f4 = local_238 - (fVar32 + fVar32);
  uStack_f0 = 0;
  fStack_ec = fStack_234;
  local_1bc = *local_270;
  local_248._0_8_ = pnVar27;
  fVar32 = fStack_234;
  fVar29 = fStack_230;
  fVar30 = fStack_22c;
  if (i == (nk_context *)0x0) {
    if (local_1bc == 2) {
      uVar20 = *pnVar27 & 2 | 4;
LAB_00137d01:
      *pnVar27 = uVar20;
      goto LAB_00137d03;
    }
  }
  else {
    if (local_1bc == 0) {
      fStack_94 = fStack_144;
      fStack_90 = fStack_140;
      fStack_8c = fStack_13c;
      fStack_84 = fStack_184;
      fStack_80 = fStack_180;
      fStack_7c = fStack_17c;
      r.y = fStack_104;
      r.x = local_108;
      r.h = fStack_f4;
      r.w = local_f8;
      fStack_134 = fStack_234;
      fStack_130 = fStack_230;
      fStack_12c = fStack_22c;
      local_138 = fVar36;
      local_98 = local_108;
      local_88 = local_188 + (float)local_168;
      iVar21 = nk_button_behavior(pnVar27,r,&i->input,NK_BUTTON_DEFAULT);
      fVar30 = fStack_12c;
      fVar29 = fStack_130;
      fVar32 = fStack_134;
      fVar36 = local_138;
      iVar22 = 1;
      if (iVar21 == 0) {
        fVar35 = (i->input).mouse.buttons[0].clicked_pos.x;
        if (((((local_188 <= fVar35) && (fVar35 < local_88)) &&
             (fVar31 = (i->input).mouse.buttons[0].clicked_pos.y, fStack_184 <= fVar31)) &&
            (((fVar31 < fStack_184 + local_138 && ((i->input).mouse.buttons[0].down == 1)) &&
             ((i->input).mouse.buttons[0].clicked != 0)))) ||
           (((local_88 <= fVar35 && (fVar35 < (local_98 - local_88) + local_88)) &&
            ((fVar31 = (i->input).mouse.buttons[0].clicked_pos.y, (float)local_228 <= fVar31 &&
             (((fVar31 < (float)local_228 + local_238 && ((i->input).mouse.buttons[0].down == 1)) &&
              ((i->input).mouse.buttons[0].clicked != 0)))))))) {
          *local_270 = 2;
        }
        else if (*local_270 != 2) goto LAB_00137d0d;
        goto LAB_00137a14;
      }
    }
    else {
      if (local_1bc != 2) goto LAB_00137d0d;
      fVar35 = (i->input).mouse.buttons[0].clicked_pos.x;
LAB_00137a14:
      iVar21 = (i->input).mouse.buttons[0].down;
      bVar12 = false;
      if ((local_208.x <= fVar35) && (bVar12 = false, fVar35 < local_118)) {
        fVar35 = (i->input).mouse.buttons[0].clicked_pos.y;
        bVar12 = iVar21 == 1 &&
                 (fVar35 < (float)local_228 + local_238 && (float)local_228 <= fVar35);
      }
      uVar20 = *(uint *)local_248._0_8_ & 2 | 4;
      *(uint *)local_248._0_8_ = uVar20;
      fVar35 = (i->input).mouse.pos.x;
      if (((local_208.x <= fVar35) && (fVar35 < local_118)) &&
         ((fVar35 = (i->input).mouse.pos.y, (float)local_228 <= fVar35 &&
          (fVar35 < (float)local_228 + local_238)))) {
        *(uint *)local_248._0_8_ = 0x12;
        uVar20 = 0x12;
      }
      pnVar27 = (nk_flags *)local_248._0_8_;
      if (bVar12 && iVar21 != 0) {
        fVar35 = local_1c0 * (i->input).mouse.delta.x;
        nVar5 = variant->kind;
        if (nVar5 == NK_PROPERTY_DOUBLE) {
          dVar9 = (double)fVar35 + (variant->value).d;
          if ((variant->max_value).d <= dVar9) {
            dVar9 = (variant->max_value).d;
          }
          dVar10 = (variant->min_value).d;
          if ((variant->min_value).d <= dVar9) {
            dVar10 = dVar9;
          }
          (variant->value).d = dVar10;
        }
        else if (nVar5 == NK_PROPERTY_FLOAT) {
          fVar35 = fVar35 + (variant->value).f;
          if ((variant->max_value).f <= fVar35) {
            fVar35 = (variant->max_value).f;
          }
          fVar31 = (variant->min_value).f;
          if ((variant->min_value).f <= fVar35) {
            fVar31 = fVar35;
          }
          (variant->value).f = fVar31;
        }
        else if (nVar5 == NK_PROPERTY_INT) {
          iVar21 = (int)fVar35 + (variant->value).i;
          if ((variant->max_value).i <= iVar21) {
            iVar21 = (variant->max_value).i;
          }
          if (iVar21 <= (variant->min_value).i) {
            iVar21 = (variant->min_value).i;
          }
          (variant->value).i = iVar21;
        }
        *(uint *)local_248._0_8_ = 0x22;
        uVar20 = 0x22;
LAB_00137cce:
        fVar35 = (i->input).mouse.prev.x;
      }
      else {
        if ((uVar20 & 0x10) == 0) goto LAB_00137cce;
        fVar35 = (i->input).mouse.prev.x;
        if ((((fVar35 < local_208.x) || (local_118 <= fVar35)) ||
            (fVar31 = (i->input).mouse.prev.y, fVar31 < (float)local_228)) ||
           ((float)local_228 + local_238 <= fVar31)) {
          uVar20 = uVar20 | 8;
          goto LAB_00137d01;
        }
      }
      if (((local_208.x <= fVar35) && (fVar35 < local_118)) &&
         ((fVar35 = (i->input).mouse.prev.y, (float)local_228 <= fVar35 &&
          (fVar35 < (float)local_228 + local_238)))) {
        uVar20 = uVar20 | 0x40;
        goto LAB_00137d01;
      }
LAB_00137d03:
      iVar22 = 0;
      if ((uVar20 & 0x20) != 0) goto LAB_00137d0d;
    }
    *local_270 = iVar22;
  }
LAB_00137d0d:
  local_228._0_4_ = (float)local_228 + local_210._0_4_;
  local_238 = local_238 * 0.5;
  b = &pnVar6->buffer;
  p_Var8 = (ctx->style).property.draw_begin;
  if (p_Var8 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    local_138 = fVar36;
    fStack_134 = fVar32;
    fStack_130 = fVar29;
    fStack_12c = fVar30;
    (*p_Var8)(b,(ctx->style).property.userdata);
    fVar36 = local_138;
    fVar32 = fStack_134;
  }
  if ((*(uint *)local_248._0_8_ & 0x20) == 0) {
    if ((*(uint *)local_248._0_8_ & 0x10) == 0) {
      pnVar23 = &(ctx->style).property;
      local_128.text = (ctx->style).property.label_normal;
    }
    else {
      pnVar23 = (nk_style_property *)&(ctx->style).property.hover;
      local_128.text = (ctx->style).property.label_hover;
    }
  }
  else {
    pnVar23 = (nk_style_property *)&(ctx->style).property.active;
    local_128.text = (ctx->style).property.label_active;
  }
  local_238 = (local_238 + (float)local_228) - (float)local_1f8._0_4_ * 0.5;
  uVar13 = CONCAT44(fVar36,(int)local_168);
  uStack_160 = CONCAT44(fVar32,local_168._4_4_);
  img = &(pnVar23->normal).data;
  local_210 = pnVar6;
  local_228 = b;
  local_168 = uVar13;
  if ((pnVar23->normal).type == NK_STYLE_ITEM_IMAGE) {
    r_00.w = local_178;
    r_00.h = fStack_174;
    r_00.x = local_208.x;
    r_00.y = local_208.y;
    nk_draw_image(b,r_00,&img->image,(nk_color)0xffffffff);
    c.r = '\0';
    c.g = '\0';
    c.b = '\0';
    c.a = '\0';
  }
  else {
    c = img->color;
    rect.w = local_178;
    rect.h = fStack_174;
    rect.x = local_208.x;
    rect.y = local_208.y;
    nk_fill_rect(b,rect,(ctx->style).property.rounding,c);
    rect_00.w = local_178;
    rect_00.h = fStack_174;
    rect_00.x = local_208.x;
    rect_00.y = local_208.y;
    nk_stroke_rect(b,rect_00,(ctx->style).property.rounding,(ctx->style).property.border,img->color)
    ;
  }
  fVar32 = local_158._4_4_;
  local_1f8._4_4_ = local_1f8._0_4_;
  local_1f8._8_4_ = local_1f8._0_4_;
  local_1f8._12_4_ = local_1f8._0_4_;
  local_158 = CONCAT44(local_238,(float)local_158);
  uStack_150 = CONCAT44(fStack_234,fVar32);
  local_128.padding.x = 0.0;
  local_128.padding.y = 0.0;
  b_00.y = fStack_184;
  b_00.x = local_188;
  b_00.w = (float)local_168;
  b_00.h = (float)local_168._4_4_;
  local_128.background = c;
  nk_widget_text(b,b_00,name,local_1b8,&local_128,0x12,(nk_user_font *)f);
  p_Var8 = (ctx->style).property.draw_end;
  if (p_Var8 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var8)(b,(ctx->style).property.userdata);
  }
  fStack_140 = fStack_144;
  behavior = local_1b4;
  auVar15 = local_1f8;
  fStack_144 = local_238;
  fStack_13c = fStack_234;
  bounds_00.w = (float)local_1f8._0_4_;
  bounds_00.h = (float)local_1f8._4_4_;
  bounds_00.x = (float)local_158;
  bounds_00.y = local_158._4_4_;
  local_1f8 = auVar15;
  iVar21 = nk_do_button_symbol((nk_flags *)local_248._0_8_,b,bounds_00,
                               (ctx->style).property.sym_left,local_1b4,
                               &(ctx->style).property.dec_button,&i->input,(nk_user_font *)f);
  auVar15 = local_1f8;
  if (iVar21 != 0) {
    nVar5 = variant->kind;
    if (nVar5 == NK_PROPERTY_DOUBLE) {
      dVar9 = (variant->value).d - (variant->step).d;
      if ((variant->max_value).d <= dVar9) {
        dVar9 = (variant->max_value).d;
      }
      dVar10 = (variant->min_value).d;
      if ((variant->min_value).d <= dVar9) {
        dVar10 = dVar9;
      }
      (variant->value).d = dVar10;
    }
    else if (nVar5 == NK_PROPERTY_FLOAT) {
      fVar32 = (variant->value).f - (variant->step).f;
      if ((variant->max_value).f <= fVar32) {
        fVar32 = (variant->max_value).f;
      }
      fVar29 = (variant->min_value).f;
      if ((variant->min_value).f <= fVar32) {
        fVar29 = fVar32;
      }
      (variant->value).f = fVar29;
    }
    else if (nVar5 == NK_PROPERTY_INT) {
      iVar21 = (variant->value).i - (variant->step).i;
      if ((variant->max_value).i <= iVar21) {
        iVar21 = (variant->max_value).i;
      }
      if (iVar21 <= (variant->min_value).i) {
        iVar21 = (variant->min_value).i;
      }
      (variant->value).i = iVar21;
    }
  }
  bounds_01.y = fStack_144;
  bounds_01.x = local_148;
  bounds_01.w = (float)local_1f8._0_4_;
  bounds_01.h = (float)local_1f8._4_4_;
  local_1f8 = auVar15;
  iVar21 = nk_do_button_symbol((nk_flags *)local_248._0_8_,local_228,bounds_01,
                               (ctx->style).property.sym_right,behavior,
                               &(ctx->style).property.inc_button,&i->input,(nk_user_font *)f);
  piVar28 = local_190;
  if (iVar21 != 0) {
    nVar5 = variant->kind;
    if (nVar5 == NK_PROPERTY_DOUBLE) {
      dVar9 = (variant->value).d + (variant->step).d;
      if ((variant->max_value).d <= dVar9) {
        dVar9 = (variant->max_value).d;
      }
      dVar10 = (variant->min_value).d;
      if ((variant->min_value).d <= dVar9) {
        dVar10 = dVar9;
      }
      (variant->value).d = dVar10;
    }
    else if (nVar5 == NK_PROPERTY_FLOAT) {
      fVar32 = (variant->value).f + (variant->step).f;
      if ((variant->max_value).f <= fVar32) {
        fVar32 = (variant->max_value).f;
      }
      fVar29 = (variant->min_value).f;
      if ((variant->min_value).f <= fVar32) {
        fVar29 = fVar32;
      }
      (variant->value).f = fVar29;
    }
    else if (nVar5 == NK_PROPERTY_INT) {
      iVar21 = (variant->step).i + (variant->value).i;
      if ((variant->max_value).i <= iVar21) {
        iVar21 = (variant->max_value).i;
      }
      if (iVar21 <= (variant->min_value).i) {
        iVar21 = (variant->min_value).i;
      }
      (variant->value).i = iVar21;
    }
  }
  if (*local_270 == 1 && local_1bc != 1) {
    nk_memcopy(local_278,local_198,(long)*local_190);
    iVar21 = nk_utf_len(local_278,*piVar28);
    *local_1e0 = iVar21;
    *local_250 = *piVar28;
    local_238 = 0.0;
    pcVar24 = local_278;
    piVar28 = local_250;
  }
  else {
    local_238 = (float)(uint)(*local_270 == 1);
    pcVar24 = local_198;
  }
  piVar18 = local_1d0;
  piVar17 = local_1d8;
  piVar16 = local_1e0;
  local_1f8[0] = i == (nk_context *)0x0;
  filter_00 = (nk_plugin_filter)(&PTR_nk_filter_decimal_00194d00)[local_1b0];
  (ctx->text_edit).undo.undo_point = 0;
  (ctx->text_edit).undo.redo_point = 99;
  (ctx->text_edit).undo.undo_char_point = 0;
  (ctx->text_edit).undo.redo_char_point = 999;
  (ctx->text_edit).select_end = 0;
  (ctx->text_edit).preferred_x = 0.0;
  (ctx->text_edit).cursor_at_end_of_line = '\0';
  (ctx->text_edit).initialized = '\x01';
  (ctx->text_edit).has_preferred_x = '\0';
  (ctx->text_edit).single_line = '\x01';
  (ctx->text_edit).filter = filter_00;
  (ctx->text_edit).scrollbar.x = 0.0;
  (ctx->text_edit).scrollbar.y = 0.0;
  (ctx->text_edit).cursor = 0;
  (ctx->text_edit).select_start = 0;
  (ctx->text_edit).active = SUB41(local_238,0);
  iVar21 = *piVar28;
  (ctx->text_edit).string.len = iVar21;
  if (*local_1e0 < iVar21) {
    iVar21 = *local_1e0;
  }
  if (iVar21 < 1) {
    iVar21 = 0;
  }
  (ctx->text_edit).cursor = iVar21;
  iVar21 = *piVar28;
  if (*local_1d8 < *piVar28) {
    iVar21 = *local_1d8;
  }
  if (iVar21 < 1) {
    iVar21 = 0;
  }
  (ctx->text_edit).select_start = iVar21;
  iVar21 = *piVar28;
  if (*local_1d0 < *piVar28) {
    iVar21 = *local_1d0;
  }
  if (iVar21 < 1) {
    iVar21 = 0;
  }
  (ctx->text_edit).select_end = iVar21;
  (ctx->text_edit).string.buffer.allocated = (long)*piVar28;
  (ctx->text_edit).string.buffer.memory.size = 0x40;
  (ctx->text_edit).string.buffer.memory.ptr = pcVar24;
  (ctx->text_edit).string.buffer.size = 0x40;
  (ctx->text_edit).mode = '\x01';
  in = (nk_context *)0x0;
  if (*local_270 == 1) {
    in = i;
  }
  bounds_02.y = fStack_104;
  bounds_02.x = local_108;
  bounds_02.h = fStack_f4;
  bounds_02.w = local_f8;
  nk_do_edit((nk_flags *)local_248._0_8_,local_228,bounds_02,0x262,filter_00,&ctx->text_edit,
             &(ctx->style).property.edit,&in->input,(nk_user_font *)f);
  *piVar28 = (ctx->text_edit).string.len;
  *piVar16 = (ctx->text_edit).cursor;
  *piVar17 = (ctx->text_edit).select_start;
  *piVar18 = (ctx->text_edit).select_end;
  uVar4 = (ctx->text_edit).active;
  if (uVar4 == '\0' || local_1f8[0] != '\0') {
    if ((local_238._0_1_ & uVar4 == '\0') != 0) {
LAB_001382ce:
      *local_270 = 0;
      local_278[*local_250] = '\0';
      nVar5 = variant->kind;
      if (nVar5 == NK_PROPERTY_INT) {
        iVar22 = nk_strtoi(local_278,(char **)0x0);
        iVar21 = (variant->max_value).i;
        if (iVar22 < (variant->max_value).i) {
          iVar21 = iVar22;
        }
        if (iVar21 <= (variant->min_value).i) {
          iVar21 = (variant->min_value).i;
        }
        (variant->value).i = iVar21;
      }
      else {
        if (nVar5 == NK_PROPERTY_FLOAT) {
          iVar21 = 0;
          pcVar24 = local_278;
          do {
            iVar22 = 1;
            if (*pcVar24 != '.') {
              if (*pcVar24 == '\0') goto LAB_00138385;
              if (iVar21 == 3) goto LAB_00138382;
              iVar22 = (uint)(0 < iVar21) + iVar21;
            }
            iVar21 = iVar22;
            pcVar24 = pcVar24 + 1;
          } while( true );
        }
        if (nVar5 == NK_PROPERTY_DOUBLE) {
          iVar21 = 0;
          pcVar24 = local_278;
          do {
            iVar22 = 1;
            if (*pcVar24 != '.') {
              if (*pcVar24 == '\0') goto LAB_001383b0;
              if (iVar21 == 3) goto LAB_001383ad;
              iVar22 = (uint)(0 < iVar21) + iVar21;
            }
            iVar21 = iVar22;
            pcVar24 = pcVar24 + 1;
          } while( true );
        }
      }
    }
    goto LAB_001383d2;
  }
  uVar20 = (i->input).keyboard.keys[4].clicked;
  if ((i->input).keyboard.keys[4].down == 0) {
    if (1 < uVar20) goto LAB_001382bf;
  }
  else if (uVar20 != 0) {
LAB_001382bf:
    (ctx->text_edit).active = '\0';
    if (local_238 != 0.0) goto LAB_001382ce;
  }
  goto LAB_001383db;
LAB_00137910:
  local_d8[lVar25] = '\0';
LAB_00137921:
  local_254 = (int)lVar25;
  local_198 = local_d8;
  local_f8 = (*(code *)f[2])(*f,(float)f[1].id,local_198,local_254);
  local_190 = &local_254;
  goto LAB_0013794f;
LAB_00138382:
  *pcVar24 = '\0';
LAB_00138385:
  dVar9 = nk_strtod(local_278,(char **)0x0);
  fVar32 = (float)dVar9;
  if ((variant->max_value).f <= (float)dVar9) {
    fVar32 = (variant->max_value).f;
  }
  fVar29 = (variant->min_value).f;
  if ((variant->min_value).f <= fVar32) {
    fVar29 = fVar32;
  }
  (variant->value).f = fVar29;
  goto LAB_001383d2;
LAB_001383ad:
  *pcVar24 = '\0';
LAB_001383b0:
  dVar9 = nk_strtod(local_278,(char **)0x0);
  iVar21 = SUB84(dVar9,0);
  uVar33 = (undefined4)((ulong)dVar9 >> 0x20);
  nVar2 = variant->max_value;
  if (nVar2.d <= dVar9) {
    iVar21 = nVar2.i;
    uVar33 = nVar2._4_4_;
  }
  nVar2 = variant->min_value;
  iVar22 = nVar2.i;
  uVar34 = nVar2._4_4_;
  if (nVar2.d <= (double)CONCAT44(uVar33,iVar21)) {
    iVar22 = iVar21;
    uVar34 = uVar33;
  }
  nVar2._4_4_ = uVar34;
  nVar2.i = iVar22;
  variant->value = nVar2;
LAB_001383d2:
  if (i == (nk_context *)0x0) {
    iVar21 = *local_270;
  }
  else {
LAB_001383db:
    pnVar6 = local_210;
    piVar28 = local_250;
    if (*local_270 == 0) {
      iVar21 = 0;
      local_210 = pnVar6;
    }
    else {
      if ((local_210->property).active != 0) {
        return;
      }
      (local_210->property).active = 1;
      nk_memcopy((local_210->property).buffer,local_278,(long)*local_250);
      (pnVar6->property).length = *piVar28;
      (pnVar6->property).cursor = *local_1e0;
      iVar21 = *local_270;
      (pnVar6->property).state = iVar21;
      (pnVar6->property).name = local_1c4;
      (pnVar6->property).select_start = *local_1d8;
      (pnVar6->property).select_end = *local_1d0;
      local_210 = pnVar6;
      if (iVar21 == 2) {
        (ctx->input).mouse.grab = '\x01';
        (ctx->input).mouse.grabbed = '\x01';
        return;
      }
    }
  }
  if (local_258 != 0 && iVar21 == 0) {
    if (local_258 == 2) {
      (ctx->input).mouse.grab = '\0';
      (ctx->input).mouse.grabbed = '\0';
      (ctx->input).mouse.ungrab = '\x01';
    }
    (local_210->property).select_start = 0;
    (local_210->property).select_end = 0;
    (local_210->property).active = 0;
  }
  return;
}

Assistant:

NK_INTERN void
nk_property(struct nk_context *ctx, const char *name, struct nk_property_variant *variant,
    float inc_per_pixel, const enum nk_property_filter filter)
{
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_input *in;
    const struct nk_style *style;

    struct nk_rect bounds;
    enum nk_widget_layout_states s;

    int *state = 0;
    nk_hash hash = 0;
    char *buffer = 0;
    int *len = 0;
    int *cursor = 0;
    int *select_begin = 0;
    int *select_end = 0;
    int old_state;

    char dummy_buffer[NK_MAX_NUMBER_BUFFER];
    int dummy_state = NK_PROPERTY_DEFAULT;
    int dummy_length = 0;
    int dummy_cursor = 0;
    int dummy_select_begin = 0;
    int dummy_select_end = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;
    s = nk_widget(&bounds, ctx);
    if (!s) return;

    /* calculate hash from name */
    if (name[0] == '#') {
        hash = nk_murmur_hash(name, (int)nk_strlen(name), win->property.seq++);
        name++; /* special number hash */
    } else hash = nk_murmur_hash(name, (int)nk_strlen(name), 42);

    /* check if property is currently hot item */
    if (win->property.active && hash == win->property.name) {
        buffer = win->property.buffer;
        len = &win->property.length;
        cursor = &win->property.cursor;
        state = &win->property.state;
        select_begin = &win->property.select_start;
        select_end = &win->property.select_end;
    } else {
        buffer = dummy_buffer;
        len = &dummy_length;
        cursor = &dummy_cursor;
        state = &dummy_state;
        select_begin =  &dummy_select_begin;
        select_end = &dummy_select_end;
    }

    /* execute property widget */
    old_state = *state;
    ctx->text_edit.clip = ctx->clip;
    in = ((s == NK_WIDGET_ROM && !win->property.active) ||
        layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    nk_do_property(&ctx->last_widget_state, &win->buffer, bounds, name,
        variant, inc_per_pixel, buffer, len, state, cursor, select_begin,
        select_end, &style->property, filter, in, style->font, &ctx->text_edit,
        ctx->button_behavior);

    if (in && *state != NK_PROPERTY_DEFAULT && !win->property.active) {
        /* current property is now hot */
        win->property.active = 1;
        NK_MEMCPY(win->property.buffer, buffer, (nk_size)*len);
        win->property.length = *len;
        win->property.cursor = *cursor;
        win->property.state = *state;
        win->property.name = hash;
        win->property.select_start = *select_begin;
        win->property.select_end = *select_end;
        if (*state == NK_PROPERTY_DRAG) {
            ctx->input.mouse.grab = nk_true;
            ctx->input.mouse.grabbed = nk_true;
        }
    }
    /* check if previously active property is now inactive */
    if (*state == NK_PROPERTY_DEFAULT && old_state != NK_PROPERTY_DEFAULT) {
        if (old_state == NK_PROPERTY_DRAG) {
            ctx->input.mouse.grab = nk_false;
            ctx->input.mouse.grabbed = nk_false;
            ctx->input.mouse.ungrab = nk_true;
        }
        win->property.select_start = 0;
        win->property.select_end = 0;
        win->property.active = 0;
    }
}